

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsReport.cpp
# Opt level: O0

QRect __thiscall KDReports::ReportPrivate::mainTextDocRect(ReportPrivate *this)

{
  bool bVar1;
  int aleft;
  int iVar2;
  int iVar3;
  int awidth;
  int aheight;
  qreal qVar4;
  qreal qVar5;
  double local_48;
  int textDocHeight;
  int textDocWidth;
  int headerHeightWithSpacing;
  int top;
  int left;
  ReportPrivate *this_local;
  
  qVar4 = mmToPixels(this->m_marginLeft);
  aleft = qRound(qVar4);
  qVar4 = mmToPixels(this->m_marginTop);
  iVar2 = qRound(qVar4);
  bVar1 = skipHeadersFooters(this);
  if (bVar1) {
    local_48 = 0.0;
  }
  else {
    local_48 = HeaderMap::height(&this->m_headers);
  }
  qVar4 = mmToPixels(this->m_headerBodySpacing);
  iVar3 = qRound(local_48 + qVar4);
  qVar4 = QSizeF::width(&this->m_paperSize);
  qVar5 = mmToPixels(this->m_marginLeft + this->m_marginRight);
  awidth = qRound(qVar4 - qVar5);
  qVar4 = mainTextDocHeight(this);
  aheight = qRound(qVar4);
  QRect::QRect((QRect *)&this_local,aleft,iVar2 + iVar3,awidth,aheight);
  return _this_local;
}

Assistant:

QRect KDReports::ReportPrivate::mainTextDocRect() const
{
    const int left = qRound(mmToPixels(m_marginLeft));
    const int top = qRound(mmToPixels(m_marginTop));
    const int headerHeightWithSpacing = qRound((skipHeadersFooters() ? 0 : m_headers.height()) + mmToPixels(m_headerBodySpacing));
    const int textDocWidth = qRound(m_paperSize.width() - mmToPixels(m_marginLeft + m_marginRight));
    const int textDocHeight = qRound(mainTextDocHeight());
    return {left, top + headerHeightWithSpacing, textDocWidth, textDocHeight};
}